

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
     ::doEndThrowingInst(Optimizer *self,Expression **currp)

{
  Expression *pEVar1;
  uintptr_t uVar2;
  ulong uVar3;
  pointer ppEVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = (long)(self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                .unwindExprStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                .unwindExprStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (lVar6 != ((long)(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                      .throwingInstsStack.
                      super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                      .throwingInstsStack.
                      super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    __assert_fail("self->unwindExprStack.size() == self->throwingInstsStack.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x104,
                  "static void wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::Optimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, Contents = wasm::(anonymous namespace)::BlockInfo]"
                 );
  }
  uVar5 = (int)lVar6 - 1;
  if (-1 < (int)uVar5) {
    do {
      uVar7 = (ulong)uVar5;
      ppEVar4 = (self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                .unwindExprStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar1 = ppEVar4[uVar7];
      if (pEVar1->_id != TryId) {
LAB_007cda2b:
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                      ,0x314,"T *wasm::Expression::cast() [T = wasm::Try]");
      }
      uVar2 = *(uintptr_t *)(pEVar1 + 7);
      if (uVar2 == 0) {
        std::
        vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
        ::push_back((self->
                    super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                    ).
                    super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                    .throwingInstsStack.
                    super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar7,
                    &(self->
                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                     ).
                     super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                     .currBasicBlock);
        if (*(long *)(pEVar1 + 5) - *(long *)(pEVar1 + 3) == 1) {
          return;
        }
        uVar5 = uVar5 - 1;
      }
      else {
        if (uVar2 == DAT_00da8070) {
          return;
        }
        ppEVar4 = ppEVar4 + uVar7;
        uVar3 = 0;
        do {
          ppEVar4 = ppEVar4 + -1;
          if (uVar7 == uVar3) {
            __assert_fail("found",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                          ,0x118,
                          "static void wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::Optimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, Contents = wasm::(anonymous namespace)::BlockInfo]"
                         );
          }
          if ((*ppEVar4)->_id != TryId) goto LAB_007cda2b;
          uVar3 = uVar3 + 1;
        } while ((*ppEVar4)[1].type.id != uVar2);
        uVar5 = uVar5 - (int)uVar3;
      }
    } while (-1 < (int)uVar5);
  }
  return;
}

Assistant:

static void doEndThrowingInst(SubType* self, Expression** currp) {
    // If the innermost try does not have a catch_all clause, an exception
    // thrown can be caught by any of its outer catch block. And if that outer
    // try-catch also does not have a catch_all, this continues until we
    // encounter a try-catch_all. Create a link to all those possible catch
    // unwind destinations.
    // TODO This can be more precise for `throw`s if we compare tag types and
    // create links to outer catch BBs only when the exception is not caught.
    // TODO This can also be more precise if we analyze the structure of nested
    // try-catches. For example, in the example below, 'call $foo' doesn't need
    // a link to the BB of outer 'catch $e1', because if the exception thrown by
    // the call is of tag $e1, it would've already been caught by the inner
    // 'catch $e1'. Optimize these cases later.
    // try
    //   try
    //     call $foo
    //   catch $e1
    //     ...
    //   catch $e2
    //     ...
    //   end
    // catch $e1
    //   ...
    // catch $e3
    //   ...
    // end
    assert(self->unwindExprStack.size() == self->throwingInstsStack.size());
    for (int i = self->throwingInstsStack.size() - 1; i >= 0;) {
      auto* tryy = self->unwindExprStack[i]->template cast<Try>();
      if (tryy->isDelegate()) {
        // If this delegates to the caller, there is no possibility that this
        // instruction can throw to outer catches.
        if (tryy->delegateTarget == DELEGATE_CALLER_TARGET) {
          break;
        }
        // If this delegates to an outer try, we skip catches between this try
        // and the target try.
        [[maybe_unused]] bool found = false;
        for (int j = i - 1; j >= 0; j--) {
          if (self->unwindExprStack[j]->template cast<Try>()->name ==
              tryy->delegateTarget) {
            i = j;
            found = true;
            break;
          }
        }
        assert(found);
        continue;
      }

      // Exception thrown. Note outselves so that we will create a link to each
      // catch within the try when we get there.
      self->throwingInstsStack[i].push_back(self->currBasicBlock);

      // If this try has catch_all, there is no possibility that this
      // instruction can throw to outer catches. Stop here.
      if (tryy->hasCatchAll()) {
        break;
      }
      i--;
    }
  }